

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::ScanLineInputFile::ScanLineInputFile
          (ScanLineInputFile *this,Header *header,IStream *is,int numThreads)

{
  byte bVar1;
  string *psVar2;
  void *pvVar3;
  Header *in_RDX;
  ScanLineInputFile *in_RSI;
  IStream *in_RDI;
  Data *unaff_retaddr;
  size_t i;
  InputStreamMutex *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff98;
  size_type *lineOffsets;
  LineOrder lineOrder;
  IStream *pIVar4;
  int numThreads_00;
  
  pIVar4 = in_RDI;
  GenericInputFile::GenericInputFile((GenericInputFile *)in_RDI);
  numThreads_00 = (int)((ulong)pIVar4 >> 0x20);
  in_RDI->_vptr_IStream = (_func_int **)&PTR__ScanLineInputFile_0374ba90;
  psVar2 = &in_RDI->_fileName;
  pvVar3 = operator_new(0x168);
  Data::Data(unaff_retaddr,numThreads_00);
  *(void **)psVar2 = pvVar3;
  lineOffsets = &(in_RDI->_fileName)._M_string_length;
  pvVar3 = operator_new(0x38);
  InputStreamMutex::InputStreamMutex(in_stack_ffffffffffffff80);
  *lineOffsets = (size_type)pvVar3;
  *(Header **)((in_RDI->_fileName)._M_string_length + 0x28) = in_RDX;
  bVar1 = (**(code **)(*(long *)&(in_RDX->_map)._M_t._M_impl + 0x10))();
  lineOrder = (LineOrder)((ulong)pvVar3 >> 0x20);
  *(byte *)(*(long *)&in_RDI->_fileName + 0x144) = bVar1 & 1;
  initialize(in_RSI,in_RDX);
  *(undefined4 *)(*(long *)&in_RDI->_fileName + 0x60) = 0;
  anon_unknown_6::readLineOffsets
            (in_RDI,lineOrder,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)lineOffsets,
             (bool *)CONCAT17(bVar1,in_stack_ffffffffffffff98));
  return;
}

Assistant:

ScanLineInputFile::ScanLineInputFile
    (const Header &header,
     OPENEXR_IMF_INTERNAL_NAMESPACE::IStream *is,
     int numThreads)
:
    _data (new Data (numThreads)),
    _streamData (new InputStreamMutex())
{
    _streamData->is = is;
    _data->memoryMapped = is->isMemoryMapped();

    try
    {

        initialize(header);
        
        //
        // (TODO) this is nasty - we need a better way of working out what type of file has been used.
        // in any case I believe this constructor only gets used with single part files
        // and 'version' currently only tracks multipart state, so setting to 0 (not multipart) works for us
        //
        
        _data->version=0;
        readLineOffsets (*_streamData->is,
                        _data->lineOrder,
                        _data->lineOffsets,
                        _data->fileIsComplete);
    }
    catch(...)
    {
        if(_data)
        {
           if (!_data->memoryMapped)
           {
              for (size_t i = 0; i < _data->lineBuffers.size(); i++)
              {
                 if( _data->lineBuffers[i] )
                 {
                   EXRFreeAligned(_data->lineBuffers[i]->buffer);
                   _data->lineBuffers[i]->buffer=nullptr;
                 }
              }
           }
        }
        delete _streamData;
        delete _data;
        throw;
    }
}